

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

sockaddr_in6 *
sznet::net::sockets::sz_sock_getlocaladdr(sockaddr_in6 *__return_storage_ptr__,sz_sock sockfd)

{
  int iVar1;
  SourceFile file;
  Logger local_1000;
  undefined1 local_30 [12];
  socklen_t local_1c [2];
  socklen_t addrlen;
  
  *(undefined8 *)((long)&(__return_storage_ptr__->sin6_addr).__in6_u + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->sin6_addr).__in6_u + 0xc) = 0;
  __return_storage_ptr__->sin6_family = 0;
  __return_storage_ptr__->sin6_port = 0;
  __return_storage_ptr__->sin6_flowinfo = 0;
  *(undefined8 *)&(__return_storage_ptr__->sin6_addr).__in6_u = 0;
  local_1c[0] = 0x1c;
  iVar1 = getsockname(sockfd,(sockaddr *)__return_storage_ptr__,local_1c);
  if (iVar1 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_30,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_30._0_8_;
    file.m_size = local_30._8_4_;
    Logger::Logger(&local_1000,file,0x165,false);
    LogStream::operator<<(&local_1000.m_impl.m_stream,"sockets::sz_sock_getlocaladdr");
    Logger::~Logger(&local_1000);
  }
  return __return_storage_ptr__;
}

Assistant:

struct sockaddr_in6 sz_sock_getlocaladdr(sz_sock sockfd)
{
	struct sockaddr_in6 localaddr;
	memset(&localaddr, 0, sizeof(localaddr));
	socklen_t addrlen = static_cast<socklen_t>(sizeof(localaddr));
	if (::getsockname(sockfd, sz_sockaddr_cast(&localaddr), &addrlen) < 0)
	{
		LOG_SYSERR << "sockets::sz_sock_getlocaladdr";
	}
	return localaddr;
}